

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O2

bool __thiscall QProgressStyleAnimation::isUpdateNeeded(QProgressStyleAnimation *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = QStyleAnimation::isUpdateNeeded((QStyleAnimation *)this);
  if ((bVar1) &&
     (iVar2 = animationStep(this), *(int *)(this + 0x28) == -1 || *(int *)(this + 0x28) != iVar2)) {
    *(int *)(this + 0x28) = iVar2;
    return true;
  }
  return false;
}

Assistant:

bool QProgressStyleAnimation::isUpdateNeeded() const
{
    if (QStyleAnimation::isUpdateNeeded()) {
        int current = animationStep();
        if (_step == -1 || _step != current)
        {
            _step = current;
            return true;
        }
    }
    return false;
}